

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.c
# Opt level: O3

int xmlBuildURISafe(xmlChar *URI,xmlChar *base,xmlChar **valPtr)

{
  uint uVar1;
  char cVar2;
  int iVar3;
  xmlChar *pxVar4;
  xmlURIPtr uri;
  xmlChar *pxVar5;
  char *pcVar6;
  xmlChar *cur;
  size_t sVar7;
  long lVar8;
  uint uVar9;
  int iVar10;
  xmlURIPtr pxVar11;
  int iVar12;
  int iVar13;
  ulong __n;
  xmlChar *pxVar14;
  xmlURIPtr bas;
  xmlURIPtr ref;
  xmlURIPtr local_60;
  xmlURIPtr local_58;
  xmlChar *local_50;
  xmlChar *local_48;
  xmlChar *local_40;
  int local_34;
  
  local_58 = (xmlURIPtr)0x0;
  local_60 = (xmlURIPtr)0x0;
  if (valPtr == (xmlChar **)0x0) {
    return 1;
  }
  *valPtr = (xmlChar *)0x0;
  if (URI == (xmlChar *)0x0) {
    return 1;
  }
  if (base == (xmlChar *)0x0) {
    pxVar4 = xmlStrdup(URI);
    if (pxVar4 != (xmlChar *)0x0) {
      *valPtr = pxVar4;
      return 0;
    }
    return -1;
  }
  if (*URI == '\0') {
LAB_0015230c:
    pxVar4 = xmlStrstr(base,"://");
    if (pxVar4 == (xmlChar *)0x0) {
      xmlFreeURI(local_58);
      *valPtr = (xmlChar *)0x0;
      if (*URI == '\0') {
        if (*base == '\0') {
          return 1;
        }
        pxVar4 = xmlStrdup(base);
        if (pxVar4 != (xmlChar *)0x0) {
          *valPtr = pxVar4;
          return 0;
        }
LAB_0015249c:
        iVar3 = -1;
        pxVar14 = (xmlChar *)0x0;
        pxVar4 = (xmlChar *)0x0;
      }
      else {
        local_40 = xmlStrchr(URI,'#');
        if (local_40 == (xmlChar *)0x0) {
          pxVar4 = (xmlChar *)0x0;
        }
        else {
          URI = xmlStrndup(URI,(int)local_40 - (int)URI);
          pxVar4 = URI;
          if (URI == (xmlChar *)0x0) goto LAB_0015249c;
        }
        iVar3 = -1;
        pxVar5 = (xmlChar *)xmlURIUnescapeString((char *)URI,-1,(char *)0x0);
        pxVar14 = (xmlChar *)0x0;
        if (pxVar5 != (xmlChar *)0x0) {
          local_48 = pxVar4;
          if ((*base == '\0') || (*pxVar5 == '/')) {
            cur = (xmlChar *)0x0;
          }
          else {
            local_50 = pxVar5;
            iVar13 = xmlStrlen(base);
            if (0 < iVar13) {
              uVar9 = iVar13 + 1;
              do {
                uVar1 = uVar9 - 1;
                __n = (ulong)uVar1;
                if (base[__n - 1] == '/') {
                  local_34 = xmlStrlen(local_50);
                  cur = (xmlChar *)(*xmlMalloc)((long)(int)(uVar9 + local_34));
                  pxVar14 = local_50;
                  pxVar4 = local_48;
                  if (cur == (xmlChar *)0x0) goto LAB_0015266a;
                  memcpy(cur,base,__n);
                  pxVar5 = local_50;
                  memcpy(cur + __n,local_50,(long)(local_34 + 1));
                  goto LAB_0015262a;
                }
                uVar9 = uVar1;
              } while (1 < (int)uVar1);
            }
            cur = (xmlChar *)0x0;
            pxVar5 = local_50;
LAB_0015262a:
            xmlNormalizePath((char *)cur,1);
          }
          pxVar14 = pxVar5;
          if (cur == (xmlChar *)0x0) {
            pxVar14 = (xmlChar *)0x0;
            cur = pxVar5;
          }
          if ((local_40 == (xmlChar *)0x0) ||
             (cur = xmlStrcat(cur,local_40), pxVar4 = local_48, cur != (xmlChar *)0x0)) {
            *valPtr = cur;
            iVar3 = 0;
            pxVar4 = local_48;
          }
        }
      }
LAB_0015266a:
      (*xmlFree)(pxVar4);
      (*xmlFree)(pxVar14);
      return iVar3;
    }
    iVar3 = xmlParseURISafe((char *)base,&local_60);
    if (iVar3 < 0) goto LAB_00152424;
    if (iVar3 == 0) {
      if (local_58 == (xmlURIPtr)0x0) {
        if (local_60->fragment != (char *)0x0) {
          (*xmlFree)(local_60->fragment);
          local_60->fragment = (char *)0x0;
        }
        pxVar4 = xmlSaveUri(local_60);
        goto LAB_001524df;
      }
      uri = (xmlURIPtr)(*xmlMalloc)(0x58);
      iVar3 = -1;
      if (uri == (xmlURIPtr)0x0) goto LAB_00152424;
      uri->fragment = (char *)0x0;
      *(undefined8 *)&uri->cleanup = 0;
      uri->path = (char *)0x0;
      uri->query = (char *)0x0;
      uri->user = (char *)0x0;
      *(undefined8 *)&uri->port = 0;
      uri->authority = (char *)0x0;
      uri->server = (char *)0x0;
      uri->scheme = (char *)0x0;
      uri->opaque = (char *)0x0;
      uri->query_raw = (char *)0x0;
      pxVar11 = local_58;
      if (local_58->scheme == (char *)0x0) {
        pxVar11 = uri;
        if ((((local_58->path == (char *)0x0) && (local_58->authority == (char *)0x0)) &&
            (local_58->server == (char *)0x0)) && (local_58->port == 0)) {
          if (local_60->scheme != (char *)0x0) {
            pcVar6 = (*xmlMemStrdup)(local_60->scheme);
            uri->scheme = pcVar6;
            if (pcVar6 == (char *)0x0) goto LAB_00152a0b;
          }
          if (local_60->authority == (char *)0x0) {
            if (local_60->server != (char *)0x0) {
              pcVar6 = (*xmlMemStrdup)(local_60->server);
              uri->server = pcVar6;
              if (pcVar6 == (char *)0x0) goto LAB_00152a0b;
            }
            if (local_60->user != (char *)0x0) {
              pcVar6 = (*xmlMemStrdup)(local_60->user);
              uri->user = pcVar6;
              if (pcVar6 == (char *)0x0) goto LAB_00152a0b;
            }
            uri->port = local_60->port;
LAB_00152868:
            if (local_60->path != (char *)0x0) {
              pcVar6 = (*xmlMemStrdup)(local_60->path);
              uri->path = pcVar6;
              if (pcVar6 == (char *)0x0) goto LAB_00152a0b;
            }
            pcVar6 = local_58->query_raw;
            if (pcVar6 == (char *)0x0) {
              pcVar6 = local_58->query;
              if (pcVar6 != (char *)0x0) {
LAB_001529d5:
                pcVar6 = (*xmlMemStrdup)(pcVar6);
                uri->query = pcVar6;
                goto LAB_001529e2;
              }
              pcVar6 = local_60->query_raw;
              if (pcVar6 != (char *)0x0) goto LAB_00152899;
              pcVar6 = local_60->query;
              if (pcVar6 != (char *)0x0) goto LAB_001529d5;
            }
            else {
LAB_00152899:
              pcVar6 = (*xmlMemStrdup)(pcVar6);
              uri->query_raw = pcVar6;
LAB_001529e2:
              if (pcVar6 == (char *)0x0) goto LAB_00152a0b;
            }
            if (local_58->fragment == (char *)0x0) goto LAB_0015240d;
            pcVar6 = (*xmlMemStrdup)(local_58->fragment);
            uri->fragment = pcVar6;
            goto LAB_00152765;
          }
          pcVar6 = (*xmlMemStrdup)(local_60->authority);
          uri->authority = pcVar6;
          if (pcVar6 != (char *)0x0) goto LAB_00152868;
        }
        else {
          if (local_60->scheme != (char *)0x0) {
            pcVar6 = (*xmlMemStrdup)(local_60->scheme);
            uri->scheme = pcVar6;
            if (pcVar6 == (char *)0x0) goto LAB_00152a0b;
          }
          if (local_58->query_raw == (char *)0x0) {
            if (local_58->query != (char *)0x0) {
              pcVar6 = (*xmlMemStrdup)(local_58->query);
              uri->query = pcVar6;
              goto LAB_00152696;
            }
          }
          else {
            pcVar6 = (*xmlMemStrdup)(local_58->query_raw);
            uri->query_raw = pcVar6;
LAB_00152696:
            if (pcVar6 == (char *)0x0) goto LAB_00152a0b;
          }
          if (local_58->fragment != (char *)0x0) {
            pcVar6 = (*xmlMemStrdup)(local_58->fragment);
            uri->fragment = pcVar6;
            if (pcVar6 == (char *)0x0) goto LAB_00152a0b;
          }
          if (local_58->authority == (char *)0x0) {
            if (local_58->server != (char *)0x0) {
              pcVar6 = (*xmlMemStrdup)(local_58->server);
              uri->server = pcVar6;
              if (pcVar6 == (char *)0x0) goto LAB_00152a0b;
LAB_00152724:
              if (local_58->user != (char *)0x0) {
                pcVar6 = (*xmlMemStrdup)(local_58->user);
                uri->user = pcVar6;
                if (pcVar6 == (char *)0x0) goto LAB_00152a0b;
              }
              uri->port = local_58->port;
              goto LAB_0015274f;
            }
            if (local_58->port != 0) goto LAB_00152724;
            if (local_60->authority == (char *)0x0) {
              if (local_60->server == (char *)0x0) {
                if (local_60->port == 0) goto LAB_001528dc;
              }
              else {
                pcVar6 = (*xmlMemStrdup)(local_60->server);
                uri->server = pcVar6;
                if (pcVar6 == (char *)0x0) goto LAB_00152a0b;
              }
              if (local_60->user != (char *)0x0) {
                pcVar6 = (*xmlMemStrdup)(local_60->user);
                uri->user = pcVar6;
                if (pcVar6 == (char *)0x0) goto LAB_00152a0b;
              }
              uri->port = local_60->port;
            }
            else {
              pcVar6 = (*xmlMemStrdup)(local_60->authority);
              uri->authority = pcVar6;
              if (pcVar6 == (char *)0x0) goto LAB_00152a0b;
            }
LAB_001528dc:
            pcVar6 = local_58->path;
            if (pcVar6 == (char *)0x0) {
              iVar13 = 2;
LAB_00152907:
              if (local_60->path != (char *)0x0) {
                sVar7 = strlen(local_60->path);
                iVar13 = iVar13 + (int)sVar7;
              }
              pcVar6 = (char *)(*xmlMalloc)((long)iVar13);
              uri->path = pcVar6;
              pxVar4 = (xmlChar *)0x0;
              iVar13 = 0;
              if (pcVar6 == (char *)0x0) goto LAB_001524ec;
              *pcVar6 = '\0';
              pcVar6 = local_60->path;
              if ((pcVar6 != (char *)0x0) && (*pcVar6 != '\0')) {
                iVar13 = 0;
                iVar3 = 0;
                do {
                  pcVar6 = pcVar6 + iVar3;
                  iVar10 = iVar3 - iVar13;
                  iVar12 = 0;
                  while( true ) {
                    iVar10 = iVar10 + 1;
                    if (*pcVar6 == '\0') goto LAB_00152a16;
                    if (*pcVar6 == '/') break;
                    iVar12 = iVar12 + -1;
                    pcVar6 = pcVar6 + 1;
                  }
                  iVar12 = iVar3 - iVar12;
                  iVar3 = iVar12 + 1;
                  if (iVar13 <= iVar12) {
                    lVar8 = (long)iVar13;
                    do {
                      uri->path[lVar8] = local_60->path[lVar8];
                      lVar8 = lVar8 + 1;
                      iVar10 = iVar10 + -1;
                      iVar13 = iVar3;
                    } while (iVar10 != 0);
                  }
                  pcVar6 = local_60->path;
                } while (pcVar6[iVar3] != '\0');
              }
LAB_00152a16:
              uri->path[iVar13] = '\0';
              if ((local_58->path != (char *)0x0) && (cVar2 = *local_58->path, cVar2 != '\0')) {
                if (iVar13 == 0) {
                  if ((local_60->server == (char *)0x0) && (local_60->port == 0)) {
                    iVar13 = 0;
                  }
                  else {
                    uri->path[iVar13] = '/';
                    cVar2 = *local_58->path;
                    iVar13 = 1;
                    if (cVar2 == '\0') goto LAB_00152ac0;
                  }
                }
                lVar8 = 0;
                do {
                  uri->path[lVar8 + iVar13] = cVar2;
                  cVar2 = local_58->path[lVar8 + 1];
                  lVar8 = lVar8 + 1;
                } while (cVar2 != '\0');
                iVar13 = iVar13 + (int)lVar8;
              }
LAB_00152ac0:
              uri->path[iVar13] = '\0';
              xmlNormalizePath(uri->path,0);
              goto LAB_0015240d;
            }
            if (*pcVar6 != '/') {
              sVar7 = strlen(pcVar6);
              iVar13 = (int)sVar7 + 2;
              goto LAB_00152907;
            }
          }
          else {
            pcVar6 = (*xmlMemStrdup)(local_58->authority);
            uri->authority = pcVar6;
            if (pcVar6 == (char *)0x0) goto LAB_00152a0b;
LAB_0015274f:
            pcVar6 = local_58->path;
            if (pcVar6 == (char *)0x0) goto LAB_0015240d;
          }
          pcVar6 = (*xmlMemStrdup)(pcVar6);
          uri->path = pcVar6;
LAB_00152765:
          if (pcVar6 != (char *)0x0) goto LAB_0015240d;
        }
LAB_00152a0b:
        pxVar4 = (xmlChar *)0x0;
        goto LAB_001524ec;
      }
LAB_0015240d:
      pxVar4 = xmlSaveUri(pxVar11);
    }
    else {
      uri = (xmlURIPtr)0x0;
      if (local_58 == (xmlURIPtr)0x0) {
        pxVar4 = (xmlChar *)0x0;
        goto LAB_001524fb;
      }
      pxVar4 = xmlSaveUri(local_58);
LAB_001524df:
      uri = (xmlURIPtr)0x0;
    }
    iVar3 = -(uint)(pxVar4 == (xmlChar *)0x0);
  }
  else {
    iVar3 = xmlParseURISafe((char *)URI,&local_58);
    if (iVar3 == 0) {
      if ((local_58 == (xmlURIPtr)0x0) || (local_58->scheme == (char *)0x0)) goto LAB_0015230c;
      pxVar4 = xmlStrdup(URI);
      goto LAB_001524df;
    }
LAB_00152424:
    pxVar4 = (xmlChar *)0x0;
    uri = (xmlURIPtr)0x0;
  }
LAB_001524ec:
  if (local_58 != (xmlURIPtr)0x0) {
    xmlFreeURI(local_58);
  }
LAB_001524fb:
  if (local_60 != (xmlURIPtr)0x0) {
    xmlFreeURI(local_60);
  }
  if (uri != (xmlURIPtr)0x0) {
    xmlFreeURI(uri);
  }
  *valPtr = pxVar4;
  return iVar3;
}

Assistant:

int
xmlBuildURISafe(const xmlChar *URI, const xmlChar *base, xmlChar **valPtr) {
    xmlChar *val = NULL;
    int ret, len, indx, cur, out;
    xmlURIPtr ref = NULL;
    xmlURIPtr bas = NULL;
    xmlURIPtr res = NULL;

    if (valPtr == NULL)
        return(1);
    *valPtr = NULL;

    if (URI == NULL)
        return(1);

    if (base == NULL) {
        val = xmlStrdup(URI);
        if (val == NULL)
            return(-1);
        *valPtr = val;
        return(0);
    }

    /*
     * 1) The URI reference is parsed into the potential four components and
     *    fragment identifier, as described in Section 4.3.
     *
     *    NOTE that a completely empty URI is treated by modern browsers
     *    as a reference to "." rather than as a synonym for the current
     *    URI.  Should we do that here?
     */
    if (URI[0] != 0)
        ret = xmlParseURISafe((const char *) URI, &ref);
    else
        ret = 0;
    if (ret != 0)
	goto done;
    if ((ref != NULL) && (ref->scheme != NULL)) {
	/*
	 * The URI is absolute don't modify.
	 */
	val = xmlStrdup(URI);
        if (val == NULL)
            ret = -1;
	goto done;
    }

    /*
     * If base has no scheme or authority, it is assumed to be a
     * filesystem path.
     */
    if (xmlStrstr(base, BAD_CAST "://") == NULL) {
        xmlFreeURI(ref);
        return(xmlResolvePath(URI, base, valPtr));
    }

#if defined(_WIN32) || defined(__CYGWIN__)
    /*
     * Resolve paths with a Windows drive letter as filesystem path
     * even if base has a scheme.
     */
    if ((ref != NULL) && (ref->path != NULL)) {
        int c = ref->path[0];

        if ((((c >= 'A') && (c <= 'Z')) ||
             ((c >= 'a') && (c <= 'z'))) &&
            (ref->path[1] == ':')) {
            xmlFreeURI(ref);
            return(xmlResolvePath(URI, base, valPtr));
        }
    }
#endif

    ret = xmlParseURISafe((const char *) base, &bas);
    if (ret < 0)
        goto done;
    if (ret != 0) {
	if (ref) {
            ret = 0;
	    val = xmlSaveUri(ref);
            if (val == NULL)
                ret = -1;
        }
	goto done;
    }
    if (ref == NULL) {
	/*
	 * the base fragment must be ignored
	 */
	if (bas->fragment != NULL) {
	    xmlFree(bas->fragment);
	    bas->fragment = NULL;
	}
	val = xmlSaveUri(bas);
        if (val == NULL)
            ret = -1;
	goto done;
    }

    /*
     * 2) If the path component is empty and the scheme, authority, and
     *    query components are undefined, then it is a reference to the
     *    current document and we are done.  Otherwise, the reference URI's
     *    query and fragment components are defined as found (or not found)
     *    within the URI reference and not inherited from the base URI.
     *
     *    NOTE that in modern browsers, the parsing differs from the above
     *    in the following aspect:  the query component is allowed to be
     *    defined while still treating this as a reference to the current
     *    document.
     */
    ret = -1;
    res = xmlCreateURI();
    if (res == NULL)
	goto done;
    if ((ref->scheme == NULL) && (ref->path == NULL) &&
	((ref->authority == NULL) && (ref->server == NULL) &&
         (ref->port == PORT_EMPTY))) {
	if (bas->scheme != NULL) {
	    res->scheme = xmlMemStrdup(bas->scheme);
            if (res->scheme == NULL)
                goto done;
        }
	if (bas->authority != NULL) {
	    res->authority = xmlMemStrdup(bas->authority);
            if (res->authority == NULL)
                goto done;
        } else {
	    if (bas->server != NULL) {
		res->server = xmlMemStrdup(bas->server);
                if (res->server == NULL)
                    goto done;
            }
	    if (bas->user != NULL) {
		res->user = xmlMemStrdup(bas->user);
                if (res->user == NULL)
                    goto done;
            }
	    res->port = bas->port;
	}
	if (bas->path != NULL) {
	    res->path = xmlMemStrdup(bas->path);
            if (res->path == NULL)
                goto done;
        }
	if (ref->query_raw != NULL) {
	    res->query_raw = xmlMemStrdup (ref->query_raw);
            if (res->query_raw == NULL)
                goto done;
        } else if (ref->query != NULL) {
	    res->query = xmlMemStrdup(ref->query);
            if (res->query == NULL)
                goto done;
        } else if (bas->query_raw != NULL) {
	    res->query_raw = xmlMemStrdup(bas->query_raw);
            if (res->query_raw == NULL)
                goto done;
        } else if (bas->query != NULL) {
	    res->query = xmlMemStrdup(bas->query);
            if (res->query == NULL)
                goto done;
        }
	if (ref->fragment != NULL) {
	    res->fragment = xmlMemStrdup(ref->fragment);
            if (res->fragment == NULL)
                goto done;
        }
	goto step_7;
    }

    /*
     * 3) If the scheme component is defined, indicating that the reference
     *    starts with a scheme name, then the reference is interpreted as an
     *    absolute URI and we are done.  Otherwise, the reference URI's
     *    scheme is inherited from the base URI's scheme component.
     */
    if (ref->scheme != NULL) {
	val = xmlSaveUri(ref);
        if (val != NULL)
            ret = 0;
	goto done;
    }
    if (bas->scheme != NULL) {
	res->scheme = xmlMemStrdup(bas->scheme);
        if (res->scheme == NULL)
            goto done;
    }

    if (ref->query_raw != NULL) {
	res->query_raw = xmlMemStrdup(ref->query_raw);
        if (res->query_raw == NULL)
            goto done;
    } else if (ref->query != NULL) {
	res->query = xmlMemStrdup(ref->query);
        if (res->query == NULL)
            goto done;
    }
    if (ref->fragment != NULL) {
	res->fragment = xmlMemStrdup(ref->fragment);
        if (res->fragment == NULL)
            goto done;
    }

    /*
     * 4) If the authority component is defined, then the reference is a
     *    network-path and we skip to step 7.  Otherwise, the reference
     *    URI's authority is inherited from the base URI's authority
     *    component, which will also be undefined if the URI scheme does not
     *    use an authority component.
     */
    if ((ref->authority != NULL) || (ref->server != NULL) ||
         (ref->port != PORT_EMPTY)) {
	if (ref->authority != NULL) {
	    res->authority = xmlMemStrdup(ref->authority);
            if (res->authority == NULL)
                goto done;
        } else {
            if (ref->server != NULL) {
                res->server = xmlMemStrdup(ref->server);
                if (res->server == NULL)
                    goto done;
            }
	    if (ref->user != NULL) {
		res->user = xmlMemStrdup(ref->user);
                if (res->user == NULL)
                    goto done;
            }
            res->port = ref->port;
	}
	if (ref->path != NULL) {
	    res->path = xmlMemStrdup(ref->path);
            if (res->path == NULL)
                goto done;
        }
	goto step_7;
    }
    if (bas->authority != NULL) {
	res->authority = xmlMemStrdup(bas->authority);
        if (res->authority == NULL)
            goto done;
    } else if ((bas->server != NULL) || (bas->port != PORT_EMPTY)) {
	if (bas->server != NULL) {
	    res->server = xmlMemStrdup(bas->server);
            if (res->server == NULL)
                goto done;
        }
	if (bas->user != NULL) {
	    res->user = xmlMemStrdup(bas->user);
            if (res->user == NULL)
                goto done;
        }
	res->port = bas->port;
    }

    /*
     * 5) If the path component begins with a slash character ("/"), then
     *    the reference is an absolute-path and we skip to step 7.
     */
    if ((ref->path != NULL) && (ref->path[0] == '/')) {
	res->path = xmlMemStrdup(ref->path);
        if (res->path == NULL)
            goto done;
	goto step_7;
    }


    /*
     * 6) If this step is reached, then we are resolving a relative-path
     *    reference.  The relative path needs to be merged with the base
     *    URI's path.  Although there are many ways to do this, we will
     *    describe a simple method using a separate string buffer.
     *
     * Allocate a buffer large enough for the result string.
     */
    len = 2; /* extra / and 0 */
    if (ref->path != NULL)
	len += strlen(ref->path);
    if (bas->path != NULL)
	len += strlen(bas->path);
    res->path = xmlMalloc(len);
    if (res->path == NULL)
	goto done;
    res->path[0] = 0;

    /*
     * a) All but the last segment of the base URI's path component is
     *    copied to the buffer.  In other words, any characters after the
     *    last (right-most) slash character, if any, are excluded.
     */
    cur = 0;
    out = 0;
    if (bas->path != NULL) {
	while (bas->path[cur] != 0) {
	    while ((bas->path[cur] != 0) && (bas->path[cur] != '/'))
		cur++;
	    if (bas->path[cur] == 0)
		break;

	    cur++;
	    while (out < cur) {
		res->path[out] = bas->path[out];
		out++;
	    }
	}
    }
    res->path[out] = 0;

    /*
     * b) The reference's path component is appended to the buffer
     *    string.
     */
    if (ref->path != NULL && ref->path[0] != 0) {
	indx = 0;
	/*
	 * Ensure the path includes a '/'
	 */
	if ((out == 0) && ((bas->server != NULL) || bas->port != PORT_EMPTY))
	    res->path[out++] = '/';
	while (ref->path[indx] != 0) {
	    res->path[out++] = ref->path[indx++];
	}
    }
    res->path[out] = 0;

    /*
     * Steps c) to h) are really path normalization steps
     */
    xmlNormalizeURIPath(res->path);

step_7:

    /*
     * 7) The resulting URI components, including any inherited from the
     *    base URI, are recombined to give the absolute form of the URI
     *    reference.
     */
    val = xmlSaveUri(res);
    if (val != NULL)
        ret = 0;

done:
    if (ref != NULL)
	xmlFreeURI(ref);
    if (bas != NULL)
	xmlFreeURI(bas);
    if (res != NULL)
	xmlFreeURI(res);
    *valPtr = val;
    return(ret);
}